

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O0

bool __thiscall IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate(PropertySymOpnd *this)

{
  bool bVar1;
  undefined1 local_21;
  undefined1 local_11;
  PropertySymOpnd *this_local;
  
  bVar1 = IsTypeCheckSeqCandidate(this);
  local_11 = 1;
  if (!bVar1) {
    bVar1 = IsTypeAvailable(this);
    local_21 = 0;
    if (!bVar1) {
      bVar1 = IsTypeChecked(this);
      local_21 = 0;
      if (!bVar1) {
        bVar1 = IsWriteGuardChecked(this);
        local_21 = 0;
        if (!bVar1) {
          bVar1 = IsTypeDead(this);
          local_21 = bVar1 ^ 0xff;
        }
      }
    }
    local_11 = local_21;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool TypeCheckSeqBitsSetOnlyIfCandidate() const
    {
        return IsTypeCheckSeqCandidate() || (!IsTypeAvailable() && !IsTypeChecked() && !IsWriteGuardChecked() && !IsTypeDead());
    }